

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<QByteArray,_QHashDummyValue> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::findNode<QByteArray>
          (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *this,QByteArray *key)

{
  byte bVar1;
  size_t hash;
  uchar *puVar2;
  QByteArrayView QVar3;
  Bucket BVar4;
  
  QVar3.m_data = (key->d).ptr;
  QVar3.m_size = (key->d).size;
  hash = qHash(QVar3,this->seed);
  BVar4 = findBucketWithHash<QByteArray>(this,key,hash);
  bVar1 = (BVar4.span)->offsets[BVar4.index];
  if (bVar1 == 0xff) {
    puVar2 = (uchar *)0x0;
  }
  else {
    puVar2 = ((BVar4.span)->entries->storage).data + (uint)bVar1 * 0x18;
  }
  return (Node<QByteArray,_QHashDummyValue> *)puVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }